

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBeadModel.cpp
# Opt level: O0

void __thiscall OpenMD::AtomicBeadModel::createBeads(AtomicBeadModel *this,Shape *shape)

{
  bool bVar1;
  uint uVar2;
  reference ppSVar3;
  AtomicBeadModel *in_RSI;
  long in_RDI;
  iterator i;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> shapes;
  Sphere *in_stack_00000128;
  AtomicBeadModel *in_stack_00000130;
  CompositeShape *in_stack_ffffffffffffff58;
  __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
  *in_stack_ffffffffffffff60;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *in_stack_ffffffffffffff70;
  __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
  local_30 [3];
  Shape *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (AtomicBeadModel *)0x0) {
    uVar2 = (*(in_RSI->super_BeadModel).super_ApproximateModel.super_HydrodynamicsModel.
              _vptr_HydrodynamicsModel[7])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(in_RSI->super_BeadModel).super_ApproximateModel.super_HydrodynamicsModel.
                _vptr_HydrodynamicsModel[8])();
      if ((uVar2 & 1) == 0) {
        snprintf(painCave.errMsg,2000,
                 "AtomicBeadModel::createBeads Error: GayBerne and other non-spherical\n\tatoms should use the RoughShell or BoundaryElement models\n"
                );
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      else {
        if (*(long *)(in_RDI + 8) != 0) {
          __dynamic_cast(*(long *)(in_RDI + 8),&Shape::typeinfo,&Sphere::typeinfo,0);
        }
        createSingleBead(in_stack_00000130,in_stack_00000128);
      }
    }
    else {
      if (in_RSI != (AtomicBeadModel *)0x0) {
        __dynamic_cast(in_RSI,&Shape::typeinfo,&CompositeShape::typeinfo,0);
      }
      CompositeShape::getShapes(in_stack_ffffffffffffff58);
      local_30[0]._M_current =
           (Shape **)
           std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::begin
                     ((vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)
                      in_stack_ffffffffffffff58);
      while( true ) {
        std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::end
                  ((vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)
                   in_stack_ffffffffffffff58);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff60,
                           (__normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                            *)in_stack_ffffffffffffff58);
        if (!bVar1) break;
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                  ::operator*(local_30);
        uVar2 = (*(*ppSVar3)->_vptr_Shape[7])();
        if ((uVar2 & 1) == 0) {
          ppSVar3 = __gnu_cxx::
                    __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                    ::operator*(local_30);
          uVar2 = (*(*ppSVar3)->_vptr_Shape[8])();
          if ((uVar2 & 1) == 0) {
            snprintf(painCave.errMsg,2000,
                     "AtomicBeadModel::createBeads Error: GayBerne and other non-spherical\n\tatoms should use the RoughShell or BoundaryElement models\n"
                    );
            painCave.severity = 1;
            painCave.isFatal = 1;
            simError();
          }
          else {
            ppSVar3 = __gnu_cxx::
                      __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                      ::operator*(local_30);
            if (*ppSVar3 == (Shape *)0x0) {
              in_stack_ffffffffffffff70 =
                   (vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)0x0;
            }
            else {
              in_stack_ffffffffffffff70 =
                   (vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)
                   __dynamic_cast(*ppSVar3,&Shape::typeinfo,&Sphere::typeinfo,0);
            }
            createSingleBead(in_stack_00000130,in_stack_00000128);
          }
        }
        else {
          ppSVar3 = __gnu_cxx::
                    __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
                    ::operator*(local_30);
          if (*ppSVar3 != (Shape *)0x0) {
            __dynamic_cast(*ppSVar3,&Shape::typeinfo,&CompositeShape::typeinfo,0);
          }
          createBeads(in_RSI,in_stack_ffffffffffffffe8);
        }
        __gnu_cxx::
        __normal_iterator<OpenMD::Shape_**,_std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>_>
        ::operator++(local_30);
      }
      std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::~vector
                (in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void AtomicBeadModel::createBeads(Shape* shape) {
    if (shape != NULL) {
      if (shape->isComposite()) {
        std::vector<Shape*> shapes =
            dynamic_cast<CompositeShape*>(shape)->getShapes();
        for (std::vector<Shape*>::iterator i = shapes.begin();
             i != shapes.end(); ++i) {
          if ((*i)->isComposite()) {
            createBeads(dynamic_cast<CompositeShape*>((*i)));
          } else {
            if ((*i)->isSpherical()) {
              createSingleBead(dynamic_cast<Sphere*>((*i)));
            } else {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "AtomicBeadModel::createBeads Error: GayBerne and other "
                       "non-spherical\n"
                       "\tatoms should use the RoughShell or BoundaryElement "
                       "models\n");
              painCave.severity = OPENMD_ERROR;
              painCave.isFatal  = 1;
              simError();
            }
          }
        }
      } else {
        if (shape->isSpherical()) {
          createSingleBead(dynamic_cast<Sphere*>(shape_));
        } else {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "AtomicBeadModel::createBeads Error: GayBerne and other "
              "non-spherical\n"
              "\tatoms should use the RoughShell or BoundaryElement models\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      }
    }
  }